

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# USBControlTransfers.cpp
# Opt level: O3

U64 __thiscall
USBPacket::AddDataStageFrames
          (USBPacket *this,USBAnalyzerResults *pResults,USBControlTransferParser *parser,U8 address)

{
  AddSyncAndPidFrames(this,pResults,FF_None);
  USBControlTransferParser::ParseDataPacket(parser,this);
  AddCRC16Frame(this,pResults);
  AddEOPFrame(this,pResults);
  AnalyzerResults::CommitResults();
  return this->mSampleEnd;
}

Assistant:

U64 USBPacket::AddDataStageFrames( USBAnalyzerResults* pResults, USBControlTransferParser& parser, U8 address )
{
    AddSyncAndPidFrames( pResults );

    parser.ParseDataPacket( *this );

    AddCRC16Frame( pResults );
    AddEOPFrame( pResults );

    pResults->CommitResults();

    return mSampleEnd;
}